

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_annotation.cpp
# Opt level: O1

ON_OBSOLETE_V2_TextObject * __thiscall
ON_OBSOLETE_V2_TextObject::operator=(ON_OBSOLETE_V2_TextObject *this,ON_OBSOLETE_V2_TextObject *src)

{
  if (this != src) {
    ON_wString::operator=(&this->m_facename,&src->m_facename);
    this->m_fontweight = src->m_fontweight;
    this->m_height = src->m_height;
    ON_OBSOLETE_V2_Annotation::operator=
              (&this->super_ON_OBSOLETE_V2_Annotation,&src->super_ON_OBSOLETE_V2_Annotation);
  }
  return this;
}

Assistant:

ON_OBSOLETE_V2_TextObject& ON_OBSOLETE_V2_TextObject::operator=(const ON_OBSOLETE_V2_TextObject& src)
{
  if ( this != &src ) {
    m_facename = src.m_facename;
    m_fontweight = src.m_fontweight;
    m_height = src.m_height;
    ON_OBSOLETE_V2_Annotation::operator=(src);
  }
  return *this;
}